

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfi.cpp
# Opt level: O1

TrackData * __thiscall
DFIDisk::load(TrackData *__return_storage_ptr__,DFIDisk *this,CylHead *cylhead,bool param_2)

{
  uchar uVar1;
  pointer puVar2;
  map<CylHead,_Data,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_> *this_00;
  CylHead *__k;
  mapped_type *pmVar3;
  int iVar4;
  mapped_type *__range1;
  pointer puVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_CylHead,_Data>_>,_std::_Rb_tree_iterator<std::pair<const_CylHead,_Data>_>_>
  pVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> flux_times;
  FluxData flux_revs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  uint local_6c;
  FluxData local_68;
  map<CylHead,_Data,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_> *local_48
  ;
  CylHead *local_40;
  TrackData *local_38;
  
  pmVar3 = std::
           map<CylHead,_Data,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_>
           ::operator[](&this->m_data,cylhead);
  if ((pmVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pmVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    TrackData::TrackData(__return_storage_ptr__,cylhead);
  }
  else {
    local_68.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_48 = &this->m_data;
    local_40 = cylhead;
    local_38 = __return_storage_ptr__;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&local_88,
               (long)(*(int *)&(pmVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                               .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(pmVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start));
    puVar5 = (pmVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (pmVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar5 != puVar2) {
      iVar4 = 0;
      do {
        uVar1 = *puVar5;
        if ((char)uVar1 < '\0') {
          std::
          vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                      *)&local_68,&local_88);
          if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                    (&local_88,
                     (long)(*(int *)&(pmVar3->
                                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(pmVar3->
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start));
        }
        else {
          iVar4 = iVar4 + (char)uVar1;
          if (uVar1 != '\x7f') {
            local_6c = iVar4 * this->m_tick_ns;
            if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_88,
                         (iterator)
                         local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_6c);
            }
            else {
              *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_6c;
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar4 = 0;
          }
        }
        puVar5 = puVar5 + 1;
      } while (puVar5 != puVar2);
    }
    __return_storage_ptr__ = local_38;
    __k = local_40;
    this_00 = local_48;
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::
      vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
      ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  *)&local_68,&local_88);
    }
    pVar6 = std::
            _Rb_tree<CylHead,_std::pair<const_CylHead,_Data>,_std::_Select1st<std::pair<const_CylHead,_Data>_>,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_>
            ::equal_range(&this_00->_M_t,__k);
    std::
    _Rb_tree<CylHead,_std::pair<const_CylHead,_Data>,_std::_Select1st<std::pair<const_CylHead,_Data>_>,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
    TrackData::TrackData(__return_storage_ptr__,__k,&local_68,false);
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

TrackData load(const CylHead& cylhead, bool /*first_read*/) override
    {
        const auto& data = m_data[cylhead];
        if (data.empty())
            return TrackData(cylhead);

        FluxData flux_revs;
        std::vector<uint32_t> flux_times;
        flux_times.reserve(data.size());

        uint32_t total_time = 0;
        for (auto byte : data)
        {
            if (byte & 0x80)
            {
                flux_revs.push_back(std::move(flux_times));
                flux_times.clear();
                flux_times.reserve(data.size());
            }
            else
            {
                total_time += byte;

                if (byte != 0x7f)
                {
                    flux_times.push_back(total_time * m_tick_ns);
                    total_time = 0;
                }
            }
        }

        if (!flux_times.empty())
            flux_revs.push_back(std::move(flux_times));

        m_data.erase(cylhead);
        return TrackData(cylhead, std::move(flux_revs));
    }